

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

size_t __thiscall efsw::String::find_first_not_of(String *this,char *s,size_t pos,size_t n)

{
  size_type sVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> bStack_38;
  
  String((String *)&bStack_38,s);
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
          find_first_not_of(&this->mString,&bStack_38,pos);
  std::__cxx11::u32string::~u32string((u32string *)&bStack_38);
  return sVar1;
}

Assistant:

std::size_t String::find_first_not_of( const char* s, std::size_t pos, std::size_t n ) const {
	return find_first_not_of( String( s ), pos );
}